

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t zeGetContextProcAddrTable(ze_api_version_t version,ze_context_dditable_t *pDdiTable)

{
  ze_pfnContextDestroy_t p_Var1;
  ze_pfnContextSystemBarrier_t p_Var2;
  ze_pfnContextEvictMemory_t p_Var3;
  ze_pfnContextEvictImage_t p_Var4;
  ze_api_version_t *pzVar5;
  ze_result_t zVar6;
  
  pzVar5 = validation_layer::context;
  if (pDdiTable == (ze_context_dditable_t *)0x0) {
    zVar6 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar6 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      p_Var1 = pDdiTable->pfnDestroy;
      *(ze_pfnContextCreate_t *)(validation_layer::context + 0x68) = pDdiTable->pfnCreate;
      *(ze_pfnContextDestroy_t *)(pzVar5 + 0x6a) = p_Var1;
      pDdiTable->pfnCreate = validation_layer::zeContextCreate;
      pDdiTable->pfnDestroy = validation_layer::zeContextDestroy;
      p_Var2 = pDdiTable->pfnSystemBarrier;
      *(ze_pfnContextGetStatus_t *)(pzVar5 + 0x6c) = pDdiTable->pfnGetStatus;
      *(ze_pfnContextSystemBarrier_t *)(pzVar5 + 0x6e) = p_Var2;
      pDdiTable->pfnGetStatus = validation_layer::zeContextGetStatus;
      pDdiTable->pfnSystemBarrier = validation_layer::zeContextSystemBarrier;
      p_Var3 = pDdiTable->pfnEvictMemory;
      *(ze_pfnContextMakeMemoryResident_t *)(pzVar5 + 0x70) = pDdiTable->pfnMakeMemoryResident;
      *(ze_pfnContextEvictMemory_t *)(pzVar5 + 0x72) = p_Var3;
      pDdiTable->pfnMakeMemoryResident = validation_layer::zeContextMakeMemoryResident;
      pDdiTable->pfnEvictMemory = validation_layer::zeContextEvictMemory;
      p_Var4 = pDdiTable->pfnEvictImage;
      *(ze_pfnContextMakeImageResident_t *)(pzVar5 + 0x74) = pDdiTable->pfnMakeImageResident;
      *(ze_pfnContextEvictImage_t *)(pzVar5 + 0x76) = p_Var4;
      pDdiTable->pfnMakeImageResident = validation_layer::zeContextMakeImageResident;
      pDdiTable->pfnEvictImage = validation_layer::zeContextEvictImage;
      *(ze_pfnContextCreateEx_t *)(pzVar5 + 0x78) = pDdiTable->pfnCreateEx;
      pDdiTable->pfnCreateEx = validation_layer::zeContextCreateEx;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar6;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetContextProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_context_dditable_t* pDdiTable                ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zeDdiTable.Context;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreate                                   = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate                                 = validation_layer::zeContextCreate;

    dditable.pfnDestroy                                  = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy                                = validation_layer::zeContextDestroy;

    dditable.pfnGetStatus                                = pDdiTable->pfnGetStatus;
    pDdiTable->pfnGetStatus                              = validation_layer::zeContextGetStatus;

    dditable.pfnSystemBarrier                            = pDdiTable->pfnSystemBarrier;
    pDdiTable->pfnSystemBarrier                          = validation_layer::zeContextSystemBarrier;

    dditable.pfnMakeMemoryResident                       = pDdiTable->pfnMakeMemoryResident;
    pDdiTable->pfnMakeMemoryResident                     = validation_layer::zeContextMakeMemoryResident;

    dditable.pfnEvictMemory                              = pDdiTable->pfnEvictMemory;
    pDdiTable->pfnEvictMemory                            = validation_layer::zeContextEvictMemory;

    dditable.pfnMakeImageResident                        = pDdiTable->pfnMakeImageResident;
    pDdiTable->pfnMakeImageResident                      = validation_layer::zeContextMakeImageResident;

    dditable.pfnEvictImage                               = pDdiTable->pfnEvictImage;
    pDdiTable->pfnEvictImage                             = validation_layer::zeContextEvictImage;

    dditable.pfnCreateEx                                 = pDdiTable->pfnCreateEx;
    pDdiTable->pfnCreateEx                               = validation_layer::zeContextCreateEx;

    return result;
}